

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

deque<cs_impl::any,_std::allocator<cs_impl::any>_> * __thiscall
cs_impl::
cni_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>(*)(std::__cxx11::string_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),std::deque<cs_impl::any,std::allocator<cs_impl::any>>(*)(std::__cxx11::string_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
::_call<0,1>(deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__return_storage_ptr__,void *this,
            vector *args,sequence<0,_1> *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar2;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_70;
  
  pbVar1 = try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  pdVar2 = try_convert_and_check<const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_1UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start + 1);
  if (*(long *)((long)this + 0x10) != 0) {
    (**(code **)((long)this + 0x18))(&local_70,this,pbVar1,pdVar2);
    std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
              (&__return_storage_ptr__->
                super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>,&local_70);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_70);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}